

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

Gia_Man_t * Abc_NtkTestTimPerformSynthesis(Gia_Man_t *p,int fChoices)

{
  Aig_Man_t *pAig;
  Gia_Man_t *pGVar1;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  Aig_Man_t *pTemp;
  Aig_Man_t *pNew;
  Gia_Man_t *pGia;
  int fChoices_local;
  Gia_Man_t *p_local;
  
  Dch_ManSetDefaultParams((Dch_Pars_t *)&pPars);
  pAig = Gia_ManToAig(p,0);
  if (fChoices == 0) {
    Pars._56_8_ = pAig;
    pTemp = Dar_ManCompress2(pAig,1,1,1,0,0);
    Aig_ManStop((Aig_Man_t *)Pars._56_8_);
  }
  else {
    pTemp = Dar_ManChoiceNew(pAig,(Dch_Pars_t *)&pPars);
  }
  pGVar1 = Gia_ManFromAig(pTemp);
  Aig_ManStop(pTemp);
  return pGVar1;
}

Assistant:

Gia_Man_t * Abc_NtkTestTimPerformSynthesis( Gia_Man_t * p, int fChoices )
{
    Gia_Man_t * pGia;
    Aig_Man_t * pNew, * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    Dch_ManSetDefaultParams( pPars );
    pNew = Gia_ManToAig( p, 0 );
    if ( fChoices )
        pNew = Dar_ManChoiceNew( pNew, pPars );
    else
    {
        pNew = Dar_ManCompress2( pTemp = pNew, 1, 1, 1, 0, 0 );
        Aig_ManStop( pTemp );
    }
    pGia = Gia_ManFromAig( pNew );
    Aig_ManStop( pNew );
    return pGia;
}